

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::InternalCreate(RTPSession *this,RTPSessionParams *sessparams)

{
  RTPSessionSources *this_00;
  RTPPacketBuilder *this_01;
  RTCPPacketBuilder *this_02;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  int iVar6;
  uint32_t uVar7;
  size_t cnamelen;
  undefined4 extraout_var;
  uint32_t ssrc;
  RTCPSchedulerParams schedparams;
  string forcedcname;
  uint8_t buf [1024];
  RTCPSchedulerParams local_490;
  size_t local_470;
  double local_468;
  RTPTime local_460;
  char *local_458;
  long local_450;
  uint8_t local_438 [1023];
  undefined1 local_39;
  
  this_01 = &this->packetbuilder;
  iVar6 = RTPPacketBuilder::Init(this_01,this->maxpacksize);
  if (iVar6 < 0) {
LAB_00122625:
    if (this->deletetransmitter == true) {
      RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
    }
    return iVar6;
  }
  if (sessparams->usepredefinedssrc == false) {
    uVar7 = (this->packetbuilder).ssrc;
  }
  else {
    uVar7 = sessparams->predefinedssrc;
    (this->packetbuilder).ssrc = uVar7;
  }
  this_00 = &this->sources;
  (this->sources).super_RTPSources.probationtype = sessparams->probationtype;
  ssrc = 0;
  if ((this->packetbuilder).init != false) {
    ssrc = uVar7;
  }
  iVar6 = RTPSources::CreateOwnSSRC(&this_00->super_RTPSources,ssrc);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    goto LAB_00122625;
  }
  iVar6 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x16])
                    (this->rtptrans,(ulong)sessparams->receivemode);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    RTPSources::Clear(&this_00->super_RTPSources);
    goto LAB_00122625;
  }
  local_468 = sessparams->owntsunit;
  local_470 = 0x400;
  std::__cxx11::string::string((string *)&local_458,(string *)&sessparams->cname);
  if (local_450 == 0) {
    iVar6 = CreateCNAME(this,local_438,&local_470,sessparams->resolvehostname);
    cnamelen = local_470;
    if (iVar6 < 0) {
      RTPPacketBuilder::Destroy(this_01);
      RTPSources::Clear(&this_00->super_RTPSources);
      if (this->deletetransmitter == true) {
        RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
      }
      goto LAB_0012288e;
    }
  }
  else {
    strncpy((char *)local_438,local_458,0x400);
    local_39 = 0;
    cnamelen = strlen((char *)local_438);
  }
  this_02 = &this->rtcpbuilder;
  iVar6 = RTCPPacketBuilder::Init(this_02,this->maxpacksize,local_468,local_438,cnamelen);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    RTPSources::Clear(&this_00->super_RTPSources);
    if (this->deletetransmitter == true) {
      RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
    }
  }
  else {
    RTCPScheduler::Reset(&this->rtcpsched);
    iVar6 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])();
    (this->rtcpsched).headeroverhead = CONCAT44(extraout_var,iVar6);
    RTCPSchedulerParams::RTCPSchedulerParams(&local_490);
    dVar4 = sessparams->sessionbandwidth;
    dVar5 = sessparams->controlfrac;
    this->sessionbandwidth = dVar4;
    this->controlfragment = dVar5;
    iVar6 = RTCPSchedulerParams::SetRTCPBandwidth(&local_490,dVar5 * dVar4);
    if (iVar6 < 0) {
      if (this->deletetransmitter == true) {
        RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
      }
      RTPPacketBuilder::Destroy(this_01);
      RTPSources::Clear(&this_00->super_RTPSources);
      RTCPPacketBuilder::Destroy(this_02);
    }
    else {
      iVar6 = RTCPSchedulerParams::SetSenderBandwidthFraction(&local_490,sessparams->senderfrac);
      if (iVar6 < 0) {
        if (this->deletetransmitter == true) {
          RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
        }
        RTPPacketBuilder::Destroy(this_01);
        RTPSources::Clear(&this_00->super_RTPSources);
        RTCPPacketBuilder::Destroy(this_02);
      }
      else {
        local_460.m_t = (sessparams->mininterval).m_t;
        iVar6 = RTCPSchedulerParams::SetMinimumTransmissionInterval(&local_490,&local_460);
        if (iVar6 < 0) {
          if (this->deletetransmitter == true) {
            RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
          }
          RTPPacketBuilder::Destroy(this_01);
          RTPSources::Clear(&this_00->super_RTPSources);
          RTCPPacketBuilder::Destroy(this_02);
        }
        else {
          local_490.usehalfatstartup = sessparams->usehalfatstartup;
          local_490.immediatebye = sessparams->immediatebye;
          (this->rtcpsched).schedparams.bandwidth = local_490.bandwidth;
          (this->rtcpsched).schedparams.senderfraction =
               (double)CONCAT62(local_490.senderfraction._2_6_,local_490.senderfraction._0_2_);
          *(ulong *)((long)&(this->rtcpsched).schedparams.senderfraction + 2) =
               CONCAT26(local_490.mininterval.m_t._0_2_,local_490.senderfraction._2_6_);
          *(undefined4 *)((long)&(this->rtcpsched).schedparams.mininterval.m_t + 2) =
               local_490.mininterval.m_t._2_4_;
          *(undefined2 *)((long)&(this->rtcpsched).schedparams.mininterval.m_t + 6) =
               local_490.mininterval.m_t._6_2_;
          (this->rtcpsched).schedparams.usehalfatstartup = local_490.usehalfatstartup;
          (this->rtcpsched).schedparams.immediatebye = local_490.immediatebye;
          this->acceptownpackets = sessparams->acceptown;
          this->sendermultiplier = sessparams->sendermultiplier;
          uVar1 = sessparams->generaltimeoutmultiplier;
          uVar2 = sessparams->byetimeoutmultiplier;
          auVar3._8_4_ = (int)uVar1;
          auVar3._0_8_ = uVar2;
          auVar3._12_4_ = (int)((ulong)uVar1 >> 0x20);
          this->byemultiplier = (double)uVar2;
          this->membermultiplier = (double)auVar3._8_8_;
          dVar4 = sessparams->notemultiplier;
          this->collisionmultiplier = sessparams->collisionmultiplier;
          this->notemultiplier = dVar4;
          this->created = true;
          iVar6 = 0;
        }
      }
    }
    RTCPSchedulerParams::~RTCPSchedulerParams(&local_490);
  }
LAB_0012288e:
  std::__cxx11::string::~string((string *)&local_458);
  return iVar6;
}

Assistant:

int RTPSession::InternalCreate(const RTPSessionParams &sessparams)
{
	int status;

	// Initialize packet builder
	
	if ((status = packetbuilder.Init(maxpacksize)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	if (sessparams.GetUsePredefinedSSRC())
		packetbuilder.AdjustSSRC(sessparams.GetPredefinedSSRC());

#ifdef RTP_SUPPORT_PROBATION

	// Set probation type
	sources.SetProbationType(sessparams.GetProbationType());

#endif // RTP_SUPPORT_PROBATION

	// Add our own ssrc to the source table
	
	if ((status = sources.CreateOwnSSRC(packetbuilder.GetSSRC())) < 0)
	{
		packetbuilder.Destroy();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set the initial receive mode
	
	if ((status = rtptrans->SetReceiveMode(sessparams.GetReceiveMode())) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Init the RTCP packet builder
	
	double timestampunit = sessparams.GetOwnTimestampUnit();
	uint8_t buf[1024];
	size_t buflen = 1024;
	std::string forcedcname = sessparams.GetCNAME(); 

	if (forcedcname.length() == 0)
	{
		if ((status = CreateCNAME(buf,&buflen,sessparams.GetResolveLocalHostname())) < 0)
		{
			packetbuilder.Destroy();
			sources.Clear();
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			return status;
		}
	}
	else
	{
		RTP_STRNCPY((char *)buf, forcedcname.c_str(), buflen);
		buf[buflen-1] = 0;
		buflen = strlen((char *)buf);
	}
	
	if ((status = rtcpbuilder.Init(maxpacksize,timestampunit,buf,buflen)) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set scheduler parameters
	
	rtcpsched.Reset();
	rtcpsched.SetHeaderOverhead(rtptrans->GetHeaderOverhead());

	RTCPSchedulerParams schedparams;

	sessionbandwidth = sessparams.GetSessionBandwidth();
	controlfragment = sessparams.GetControlTrafficFraction();
	
	if ((status = schedparams.SetRTCPBandwidth(sessionbandwidth*controlfragment)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetSenderBandwidthFraction(sessparams.GetSenderControlBandwidthFraction())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetMinimumTransmissionInterval(sessparams.GetMinimumRTCPTransmissionInterval())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	schedparams.SetUseHalfAtStartup(sessparams.GetUseHalfRTCPIntervalAtStartup());
	schedparams.SetRequestImmediateBYE(sessparams.GetRequestImmediateBYE());
	
	rtcpsched.SetParameters(schedparams);

	// copy other parameters
	
	acceptownpackets = sessparams.AcceptOwnPackets();
	membermultiplier = sessparams.GetSourceTimeoutMultiplier();
	sendermultiplier = sessparams.GetSenderTimeoutMultiplier();
	byemultiplier = sessparams.GetBYETimeoutMultiplier();
	collisionmultiplier = sessparams.GetCollisionTimeoutMultiplier();
	notemultiplier = sessparams.GetNoteTimeoutMultiplier();

	// Do thread stuff if necessary
	
#ifdef RTP_SUPPORT_THREAD
	pollthread = 0;
	if (usingpollthread)
	{
		if (!sourcesmutex.IsInitialized())	
		{
			if (sourcesmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!buildermutex.IsInitialized())
		{
			if (buildermutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!schedmutex.IsInitialized())
		{
			if (schedmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!packsentmutex.IsInitialized())
		{
			if (packsentmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		
		pollthread = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPOLLTHREAD) RTPPollThread(*this,rtcpsched);
		if (pollthread == 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return ERR_RTP_OUTOFMEM;
		}
		if ((status = pollthread->Start(rtptrans)) < 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			RTPDelete(pollthread,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return status;
		}
	}
#endif // RTP_SUPPORT_THREAD	

	created = true;
	return 0;
}